

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_alltoall_multiple
          (bsc_step_t depends,bsc_pid_t root,bsc_group_t group,bsc_coll_params_t *set,bsc_size_t n)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)n;
  if (n < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 * 0x30 - uVar2 != 0; uVar2 = uVar2 + 0x30) {
    bsc_alltoall_single(depends,group,*(void **)((long)&set->src + uVar2),
                        *(void **)((long)&set->dst + uVar2),
                        *(bsc_size_t *)((long)&set->size + uVar2));
  }
  return depends + 1;
}

Assistant:

bsc_step_t bsc_alltoall_multiple( bsc_step_t depends,
                        bsc_pid_t root, bsc_group_t group,
                        bsc_coll_params_t * set, bsc_size_t n )
{
    bsc_size_t i;
    (void) root;
    for ( i = 0; i < n ; ++i )
        bsc_alltoall_single( depends, group,
                set[i].src, set[i].dst, set[i].size );
    return depends + 1;
}